

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPToken cp_number(CPState *cp)

{
  byte *pbVar1;
  TValue local_a8;
  TValue o;
  CPState *pCStack_98;
  StrScanFmt fmt;
  CPState *cp_local;
  int local_88;
  undefined4 local_84;
  CPState *local_80;
  CPChar local_74;
  CPState *local_70;
  char *local_68;
  char *w;
  SBuf *local_58;
  char *local_50;
  char *w_1;
  SBuf *local_40;
  undefined4 local_34;
  SBuf *local_30;
  char *local_28;
  undefined4 local_1c;
  SBuf *local_18;
  char *local_10;
  
  pCStack_98 = cp;
  do {
    local_74 = pCStack_98->c;
    local_70 = pCStack_98;
    local_58 = &pCStack_98->sb;
    local_1c = 1;
    w._4_4_ = local_74;
    local_18 = local_58;
    if ((int)(pCStack_98->sb).e == (int)local_58->w) {
      local_10 = lj_buf_more2(local_58,1);
    }
    else {
      local_10 = local_58->w;
    }
    local_68 = local_10 + 1;
    *local_10 = (char)w._4_4_;
    local_58->w = local_68;
    cp_local = pCStack_98;
    pbVar1 = (byte *)pCStack_98->p;
    pCStack_98->p = (char *)(pbVar1 + 1);
    pCStack_98->c = (uint)*pbVar1;
    if (pCStack_98->c == 0x5c) {
      local_88 = cp_get_bs(pCStack_98);
    }
    else {
      local_88 = pCStack_98->c;
    }
  } while ((""[(long)local_88 + 1] & 0x80) != 0);
  local_80 = pCStack_98;
  local_84 = 0;
  local_40 = &pCStack_98->sb;
  w_1._4_4_ = 0;
  local_34 = 1;
  local_30 = local_40;
  if ((int)(pCStack_98->sb).e == (int)local_40->w) {
    local_28 = lj_buf_more2(local_40,1);
  }
  else {
    local_28 = local_40->w;
  }
  local_50 = local_28 + 1;
  *local_28 = (char)w_1._4_4_;
  local_40->w = local_50;
  o.field_4.it = lj_strscan_scan((uint8_t *)(pCStack_98->sb).b,
                                 ((int)(pCStack_98->sb).w - (int)(pCStack_98->sb).b) - 1,&local_a8,
                                 0x10);
  if (o.field_4.it == STRSCAN_INT) {
    (pCStack_98->val).id = 9;
  }
  else if (o.field_4.it == STRSCAN_U32) {
    (pCStack_98->val).id = 10;
  }
  else if ((pCStack_98->mode & 0x20) == 0) {
    cp_errmsg(pCStack_98,0x102,LJ_ERR_XNUMBER);
  }
  (pCStack_98->val).field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)local_a8.field_4.i;
  return 0x102;
}

Assistant:

static CPToken cp_number(CPState *cp)
{
  StrScanFmt fmt;
  TValue o;
  do { cp_save(cp, cp->c); } while (lj_char_isident(cp_get(cp)));
  cp_save(cp, '\0');
  fmt = lj_strscan_scan((const uint8_t *)(cp->sb.b), sbuflen(&cp->sb)-1,
			&o, STRSCAN_OPT_C);
  if (fmt == STRSCAN_INT) cp->val.id = CTID_INT32;
  else if (fmt == STRSCAN_U32) cp->val.id = CTID_UINT32;
  else if (!(cp->mode & CPARSE_MODE_SKIP))
    cp_errmsg(cp, CTOK_INTEGER, LJ_ERR_XNUMBER);
  cp->val.u32 = (uint32_t)o.i;
  return CTOK_INTEGER;
}